

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3AddPrimaryKey(Parse *pParse,ExprList *pList,int onError,int autoInc,int sortOrder)

{
  u8 *puVar1;
  uint uVar2;
  Table *pTVar3;
  Column *pCVar4;
  ushort uVar5;
  int iVar6;
  Expr *pEVar7;
  ulong uVar8;
  char *pcVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  bool bVar14;
  Column *local_58;
  
  pTVar3 = pParse->pNewTable;
  if (pTVar3 != (Table *)0x0) {
    if ((pTVar3->tabFlags & 4) == 0) {
      pTVar3->tabFlags = pTVar3->tabFlags | 4;
      if (pList == (ExprList *)0x0) {
        uVar12 = (long)pTVar3->nCol - 1;
        local_58 = pTVar3->aCol + uVar12;
        puVar1 = &pTVar3->aCol[uVar12].colFlags;
        *puVar1 = *puVar1 | 1;
        bVar14 = true;
      }
      else {
        uVar2 = pList->nExpr;
        uVar10 = 0;
        if (0 < (int)uVar2) {
          uVar10 = (ulong)uVar2;
        }
        uVar12 = 0xffffffffffffffff;
        local_58 = (Column *)0x0;
        for (uVar8 = 0; uVar8 != uVar10; uVar8 = uVar8 + 1) {
          pEVar7 = sqlite3ExprSkipCollate(pList->a[uVar8].pExpr);
          sqlite3StringToId(pEVar7);
          if (pEVar7->op == ';') {
            uVar5 = pTVar3->nCol;
            if ((short)uVar5 < 1) {
              uVar5 = 0;
            }
            pcVar9 = (pEVar7->u).zToken;
            uVar12 = (ulong)uVar5;
            lVar11 = 0;
            for (uVar13 = 0; uVar12 != uVar13; uVar13 = uVar13 + 1) {
              pCVar4 = pTVar3->aCol;
              iVar6 = sqlite3StrICmp(pcVar9,*(char **)((long)&pCVar4->zName + lVar11));
              if (iVar6 == 0) {
                local_58 = (Column *)((long)&pCVar4->zName + lVar11);
                (&pCVar4->colFlags)[lVar11] = (&pCVar4->colFlags)[lVar11] | 1;
                uVar12 = uVar13 & 0xffffffff;
                break;
              }
              lVar11 = lVar11 + 0x20;
            }
          }
        }
        bVar14 = uVar2 == 1;
      }
      if ((bVar14) && (local_58 != (Column *)0x0)) {
        pcVar9 = sqlite3ColumnType(local_58,"");
        iVar6 = sqlite3StrICmp(pcVar9,"INTEGER");
        if ((sortOrder != 1) && (iVar6 == 0)) {
          if ((pList != (ExprList *)0x0) && (1 < pParse->eParseMode)) {
            pEVar7 = sqlite3ExprSkipCollate(pList->a[0].pExpr);
            sqlite3RenameTokenRemap(pParse,&pTVar3->iPKey,pEVar7);
          }
          pTVar3->tabFlags = pTVar3->tabFlags | autoInc << 3;
          pTVar3->iPKey = (i16)uVar12;
          pTVar3->keyConf = (u8)onError;
          if (pList == (ExprList *)0x0) {
            pList = (ExprList *)0x0;
          }
          else {
            pParse->iPkSortOrder = pList->a[0].sortOrder;
          }
          goto LAB_00168562;
        }
      }
      if (autoInc == 0) {
        sqlite3CreateIndex(pParse,(Token *)0x0,(Token *)0x0,(SrcList *)0x0,pList,onError,
                           (Token *)0x0,(Expr *)0x0,sortOrder,0,'\x02');
        pList = (ExprList *)0x0;
      }
      else {
        sqlite3ErrorMsg(pParse,"AUTOINCREMENT is only allowed on an INTEGER PRIMARY KEY");
      }
    }
    else {
      sqlite3ErrorMsg(pParse,"table \"%s\" has more than one primary key",pTVar3->zName);
    }
  }
LAB_00168562:
  sqlite3ExprListDelete(pParse->db,pList);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3AddPrimaryKey(
  Parse *pParse,    /* Parsing context */
  ExprList *pList,  /* List of field names to be indexed */
  int onError,      /* What to do with a uniqueness conflict */
  int autoInc,      /* True if the AUTOINCREMENT keyword is present */
  int sortOrder     /* SQLITE_SO_ASC or SQLITE_SO_DESC */
){
  Table *pTab = pParse->pNewTable;
  Column *pCol = 0;
  int iCol = -1, i;
  int nTerm;
  if( pTab==0 ) goto primary_key_exit;
  if( pTab->tabFlags & TF_HasPrimaryKey ){
    sqlite3ErrorMsg(pParse, 
      "table \"%s\" has more than one primary key", pTab->zName);
    goto primary_key_exit;
  }
  pTab->tabFlags |= TF_HasPrimaryKey;
  if( pList==0 ){
    iCol = pTab->nCol - 1;
    pCol = &pTab->aCol[iCol];
    pCol->colFlags |= COLFLAG_PRIMKEY;
    nTerm = 1;
  }else{
    nTerm = pList->nExpr;
    for(i=0; i<nTerm; i++){
      Expr *pCExpr = sqlite3ExprSkipCollate(pList->a[i].pExpr);
      assert( pCExpr!=0 );
      sqlite3StringToId(pCExpr);
      if( pCExpr->op==TK_ID ){
        const char *zCName = pCExpr->u.zToken;
        for(iCol=0; iCol<pTab->nCol; iCol++){
          if( sqlite3StrICmp(zCName, pTab->aCol[iCol].zName)==0 ){
            pCol = &pTab->aCol[iCol];
            pCol->colFlags |= COLFLAG_PRIMKEY;
            break;
          }
        }
      }
    }
  }
  if( nTerm==1
   && pCol
   && sqlite3StrICmp(sqlite3ColumnType(pCol,""), "INTEGER")==0
   && sortOrder!=SQLITE_SO_DESC
  ){
    if( IN_RENAME_OBJECT && pList ){
      Expr *pCExpr = sqlite3ExprSkipCollate(pList->a[0].pExpr);
      sqlite3RenameTokenRemap(pParse, &pTab->iPKey, pCExpr);
    }
    pTab->iPKey = iCol;
    pTab->keyConf = (u8)onError;
    assert( autoInc==0 || autoInc==1 );
    pTab->tabFlags |= autoInc*TF_Autoincrement;
    if( pList ) pParse->iPkSortOrder = pList->a[0].sortOrder;
  }else if( autoInc ){
#ifndef SQLITE_OMIT_AUTOINCREMENT
    sqlite3ErrorMsg(pParse, "AUTOINCREMENT is only allowed on an "
       "INTEGER PRIMARY KEY");
#endif
  }else{
    sqlite3CreateIndex(pParse, 0, 0, 0, pList, onError, 0,
                           0, sortOrder, 0, SQLITE_IDXTYPE_PRIMARYKEY);
    pList = 0;
  }

primary_key_exit:
  sqlite3ExprListDelete(pParse->db, pList);
  return;
}